

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::anon_unknown_26::ANSIColourImpl::use(ANSIColourImpl *this,Code _colourCode)

{
  int iVar1;
  undefined4 extraout_var;
  char *escapeCode;
  anon_class_8_1_ba1d6aae setColour;
  ReusableStringStream local_50;
  anon_class_8_1_ba1d6aae local_40;
  string local_38;
  SourceLineInfo local_18;
  
  iVar1 = (*((this->super_ColourImpl).m_stream)->_vptr_IStream[2])();
  local_40.out = (ostream *)CONCAT44(extraout_var,iVar1);
  switch(_colourCode) {
  case None:
  case Headers:
    escapeCode = "[0m";
    break;
  case Red:
    escapeCode = "[0;31m";
    break;
  case Green:
    escapeCode = "[0;32m";
    break;
  case Blue:
    escapeCode = "[0;34m";
    break;
  case Cyan:
    escapeCode = "[0;36m";
    break;
  case Yellow:
    escapeCode = "[0;33m";
    break;
  case Grey:
    escapeCode = "[1;30m";
    break;
  default:
    ReusableStringStream::ReusableStringStream(&local_50);
    local_18.file =
         "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
    ;
    local_18.line = 0xd3e;
    Catch::operator<<(local_50.m_oss,&local_18);
    std::operator<<(local_50.m_oss,": Internal Catch2 error: ");
    std::operator<<(local_50.m_oss,"Unknown colour requested");
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_38);
  case Bright:
    ReusableStringStream::ReusableStringStream(&local_50);
    local_18.file =
         "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
    ;
    local_18.line = 0xd3d;
    Catch::operator<<(local_50.m_oss,&local_18);
    std::operator<<(local_50.m_oss,": Internal Catch2 error: ");
    std::operator<<(local_50.m_oss,"not a colour");
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_38);
  case BrightWhite:
    escapeCode = "[1;37m";
    break;
  case BrightRed:
    escapeCode = "[1;31m";
    break;
  case BrightGreen:
    escapeCode = "[1;32m";
    break;
  case BrightYellow:
    escapeCode = "[1;33m";
    break;
  case FileName:
    escapeCode = "[0;37m";
  }
  use::anon_class_8_1_ba1d6aae::operator()(&local_40,escapeCode);
  return;
}

Assistant:

void use( Colour::Code _colourCode ) const override {
            auto setColour = [&out =
                                  m_stream->stream()]( char const* escapeCode ) {
                // The escape sequence must be flushed to console, otherwise
                // if stdin and stderr are intermixed, we'd get accidentally
                // coloured output.
                out << '\033' << escapeCode << std::flush;
            };
            switch( _colourCode ) {
                case Colour::None:
                case Colour::White:     return setColour( "[0m" );
                case Colour::Red:       return setColour( "[0;31m" );
                case Colour::Green:     return setColour( "[0;32m" );
                case Colour::Blue:      return setColour( "[0;34m" );
                case Colour::Cyan:      return setColour( "[0;36m" );
                case Colour::Yellow:    return setColour( "[0;33m" );
                case Colour::Grey:      return setColour( "[1;30m" );

                case Colour::LightGrey:     return setColour( "[0;37m" );
                case Colour::BrightRed:     return setColour( "[1;31m" );
                case Colour::BrightGreen:   return setColour( "[1;32m" );
                case Colour::BrightWhite:   return setColour( "[1;37m" );
                case Colour::BrightYellow:  return setColour( "[1;33m" );

                case Colour::Bright: CATCH_INTERNAL_ERROR( "not a colour" );
                default: CATCH_INTERNAL_ERROR( "Unknown colour requested" );
            }
        }